

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O2

wchar_t archive_match_excluded(archive *_a,archive_entry *entry)

{
  int iVar1;
  wchar_t wVar2;
  char *pcVar3;
  uint uVar4;
  void *pathname;
  
  iVar1 = __archive_check_magic(_a,0xcad11c9,1,"archive_match_excluded_ae");
  if (iVar1 == -0x1e) {
    wVar2 = L'\xffffffe2';
  }
  else if (entry == (archive_entry *)0x0) {
    archive_set_error(_a,0x16,"entry is NULL");
    wVar2 = L'\xffffffe7';
  }
  else {
    uVar4 = _a[1].magic;
    if ((uVar4 & 1) != 0) {
      pcVar3 = archive_entry_pathname(entry);
      wVar2 = path_excluded((archive_match *)_a,(wchar_t)pcVar3,pathname);
      if (wVar2 != L'\0') {
        return wVar2;
      }
      uVar4 = _a[1].magic;
    }
    if ((uVar4 & 2) != 0) {
      wVar2 = time_excluded((archive_match *)_a,entry);
      if (wVar2 != L'\0') {
        return L'\x01';
      }
      uVar4 = _a[1].magic;
    }
    wVar2 = L'\0';
    if ((uVar4 & 4) != 0) {
      wVar2 = owner_excluded((archive_match *)_a,entry);
      return wVar2;
    }
  }
  return wVar2;
}

Assistant:

int
archive_match_excluded(struct archive *_a, struct archive_entry *entry)
{
	struct archive_match *a;
	int r;

	archive_check_magic(_a, ARCHIVE_MATCH_MAGIC,
	    ARCHIVE_STATE_NEW, "archive_match_excluded_ae");

	a = (struct archive_match *)_a;
	if (entry == NULL) {
		archive_set_error(&(a->archive), EINVAL, "entry is NULL");
		return (ARCHIVE_FAILED);
	}

	r = 0;
	if (a->setflag & PATTERN_IS_SET) {
#if defined(_WIN32) && !defined(__CYGWIN__)
		r = path_excluded(a, 0, archive_entry_pathname_w(entry));
#else
		r = path_excluded(a, 1, archive_entry_pathname(entry));
#endif
		if (r != 0)
			return (r);
	}

	if (a->setflag & TIME_IS_SET) {
		r = time_excluded(a, entry);
		if (r != 0)
			return (r);
	}

	if (a->setflag & ID_IS_SET)
		r = owner_excluded(a, entry);
	return (r);
}